

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::sr::anon_unknown_0::TriangleDerivateCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,TriangleDerivateCaseInstance *this)

{
  int iVar1;
  int iVar2;
  TestContext *this_00;
  TestLog *this_01;
  IVec3 *size;
  void *data;
  TestLog *this_02;
  allocator<char> local_471;
  string local_470;
  undefined4 local_450;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  string local_420;
  allocator<char> local_3f9;
  string local_3f8;
  LogImage local_3d8;
  ConstPixelBufferAccess local_348;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  LogImage local_2d0;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  LogImageSet local_1f0;
  PixelBufferAccess local_1b0;
  PixelBufferAccess local_188;
  byte local_15d;
  deUint32 local_15c;
  undefined1 local_158 [3];
  bool isOk;
  PixelBufferAccess local_148;
  undefined1 local_120 [8];
  Surface errorMask;
  ConstPixelBufferAccess local_e0;
  PixelBufferAccess local_b8;
  TextureFormat local_90;
  TextureFormat dataFormat;
  TextureLevel *renderedImage;
  undefined1 local_60 [8];
  TextureLevel resultImage;
  deUint16 indices [6];
  deUint32 numTriangles;
  deUint32 numVertices;
  TestLog *log;
  TriangleDerivateCaseInstance *this_local;
  
  this_00 = Context::getTestContext
                      ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  resultImage.m_data.m_cap = 0x2000100020000;
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_60);
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[4])();
  ShaderRenderCaseInstance::getDefaultConstCoords();
  ShaderRenderCaseInstance::render
            (&this->super_ShaderRenderCaseInstance,4,2,(deUint16 *)&resultImage.m_data.m_cap,
             (Vec4 *)((long)&renderedImage + 4));
  dataFormat = (TextureFormat)
               ShaderRenderCaseInstance::getResultImage(&this->super_ShaderRenderCaseInstance);
  if (this->m_definitions->surfaceType == SURFACETYPE_FLOAT_FBO) {
    tcu::TextureFormat::TextureFormat(&local_90,RGBA,FLOAT);
    iVar1 = tcu::TextureLevel::getWidth((TextureLevel *)dataFormat);
    iVar2 = tcu::TextureLevel::getHeight((TextureLevel *)dataFormat);
    tcu::TextureLevel::setStorage((TextureLevel *)local_60,&local_90,iVar1,iVar2,1);
    tcu::TextureLevel::getAccess(&local_b8,(TextureLevel *)local_60);
    size = tcu::TextureLevel::getSize((TextureLevel *)dataFormat);
    tcu::TextureLevel::getAccess
              ((ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap,(TextureLevel *)dataFormat);
    data = tcu::ConstPixelBufferAccess::getDataPtr
                     ((ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_e0,&local_90,size,data);
    tcu::copy((EVP_PKEY_CTX *)&local_b8,(EVP_PKEY_CTX *)&local_e0);
  }
  else {
    tcu::TextureLevel::operator=((TextureLevel *)local_60,(TextureLevel *)dataFormat);
  }
  iVar1 = tcu::TextureLevel::getWidth((TextureLevel *)local_60);
  iVar2 = tcu::TextureLevel::getHeight((TextureLevel *)local_60);
  tcu::Surface::Surface((Surface *)local_120,iVar1,iVar2);
  tcu::Surface::getAccess(&local_148,(Surface *)local_120);
  local_15c = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)local_158);
  tcu::clear(&local_148,(Vec4 *)local_158);
  tcu::TextureLevel::getAccess(&local_188,(TextureLevel *)local_60);
  tcu::Surface::getAccess(&local_1b0,(Surface *)local_120);
  iVar1 = (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[7])
                    (this,&local_188,&local_1b0);
  local_15d = (byte)iVar1 & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"Result",&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"Result images",&local_239);
  tcu::LogImageSet::LogImageSet(&local_1f0,&local_210,&local_238);
  this_02 = tcu::TestLog::operator<<(this_01,&local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"Rendered",&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"Rendered image",&local_319);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_348,(TextureLevel *)local_60);
  tcu::LogImage::LogImage
            (&local_2d0,&local_2f0,&local_318,&local_348,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(this_02,&local_2d0);
  tcu::LogImage::~LogImage(&local_2d0);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  tcu::LogImageSet::~LogImageSet(&local_1f0);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  if ((local_15d & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"ErrorMask",&local_3f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"Error mask",&local_421)
    ;
    tcu::LogImage::LogImage
              (&local_3d8,&local_3f8,&local_420,(Surface *)local_120,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::TestLog::operator<<(this_01,&local_3d8);
    tcu::LogImage::~LogImage(&local_3d8);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator(&local_421);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
  }
  tcu::TestLog::operator<<(this_01,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  if ((local_15d & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,"Image comparison failed",&local_471);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator(&local_471);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"Pass",&local_449);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator(&local_449);
  }
  local_450 = 1;
  tcu::Surface::~Surface((Surface *)local_120);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_60);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TriangleDerivateCaseInstance::iterate (void)
{
	tcu::TestLog&				log				= m_context.getTestContext().getLog();
	const deUint32				numVertices		= 4;
	const deUint32				numTriangles	= 2;
	const deUint16				indices[]		= { 0, 2, 1, 2, 3, 1 };
	tcu::TextureLevel			resultImage;

	setup();

	render(numVertices, numTriangles, indices);

	{
		const tcu::TextureLevel&		renderedImage	= getResultImage();

		if (m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO)
		{
			const tcu::TextureFormat	dataFormat		(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT);

			resultImage.setStorage(dataFormat, renderedImage.getWidth(), renderedImage.getHeight());
			tcu::copy(resultImage.getAccess(), tcu::ConstPixelBufferAccess(dataFormat, renderedImage.getSize(), renderedImage.getAccess().getDataPtr()));
		}
		else
		{
			resultImage = renderedImage;
		}
	}

	// Verify
	{
		tcu::Surface errorMask(resultImage.getWidth(), resultImage.getHeight());
		tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toVec());

		const bool isOk = verify(resultImage.getAccess(), errorMask.getAccess());

		log << TestLog::ImageSet("Result", "Result images")
			<< TestLog::Image("Rendered", "Rendered image", resultImage);

		if (!isOk)
			log << TestLog::Image("ErrorMask", "Error mask", errorMask);

		log << TestLog::EndImageSet;

		if (isOk)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Image comparison failed");
	}
}